

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O3

float16 float16_sub_sparc64(float16 a,float16 b,float_status *status)

{
  long lVar1;
  uint uVar2;
  FloatClass FVar3;
  FloatClass FVar4;
  byte bVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  int iVar10;
  ulong uVar11;
  uint uVar12;
  uint64_t uVar13;
  ulong uVar14;
  FloatParts part;
  FloatParts FVar15;
  FloatParts FVar16;
  FloatParts FVar17;
  
  FVar16._8_8_ = (ulong)(a >> 10 & 0x1f) | (ulong)(a & 0x8000) << 0x19;
  FVar16.frac = (ulong)(a & 0x3ff);
  FVar15 = sf_canonicalize(FVar16,&float16_params,status);
  uVar14 = FVar15._8_8_;
  uVar9 = FVar15.frac;
  part._8_8_ = (ulong)(b >> 10 & 0x1f) | (ulong)(b & 0x8000) << 0x19;
  part.frac = (ulong)(b & 0x3ff);
  FVar16 = sf_canonicalize(part,&float16_params,status);
  uVar11 = FVar16._8_8_;
  uVar8 = FVar16.frac;
  uVar2 = FVar15._12_4_;
  uVar12 = uVar2 >> 8;
  FVar3 = FVar15.cls;
  FVar4 = FVar16.cls;
  iVar7 = FVar15.exp;
  iVar10 = FVar16.exp;
  FVar17 = FVar15;
  if (FVar15.sign == ((uVar11 & 0xff0000000000) != 0x10000000000)) {
    if (FVar4 == float_class_normal && FVar3 == float_class_normal) {
      iVar6 = iVar7 - iVar10;
      if (iVar6 == 0 || iVar7 < iVar10) {
        if (iVar7 < iVar10) {
          if (iVar10 - iVar7 < 0x40) {
            bVar5 = (byte)(iVar10 - iVar7);
            uVar9 = (ulong)(uVar9 << (-bVar5 & 0x3f) != 0) | uVar9 >> (bVar5 & 0x3f);
          }
          else {
            uVar9 = (ulong)(uVar9 != 0);
          }
          uVar14 = uVar14 & 0xffffffff00000000 | uVar11 & 0xffffffff;
          FVar15.exp = (int)uVar14;
          FVar15.cls = (char)(uVar14 >> 0x20);
          FVar15.sign = (_Bool)(char)(uVar14 >> 0x28);
          FVar15._14_2_ = (short)(uVar14 >> 0x30);
          FVar15.frac = uVar9;
        }
      }
      else if (iVar6 < 0x40) {
        uVar8 = (ulong)(uVar8 << (-(byte)iVar6 & 0x3f) != 0) | uVar8 >> ((byte)iVar6 & 0x3f);
      }
      else {
        uVar8 = (ulong)(uVar8 != 0);
      }
      uVar9 = FVar15._8_8_;
      uVar8 = FVar15.frac + uVar8;
      FVar17.exp = (int)uVar9;
      FVar17.cls = (char)(uVar9 >> 0x20);
      FVar17.sign = (_Bool)(char)(uVar9 >> 0x28);
      FVar17._14_2_ = (short)(uVar9 >> 0x30);
      FVar17.frac = uVar8;
      if ((long)uVar8 < 0) {
        uVar9 = uVar9 & 0xffffffff00000000 | (ulong)(FVar15.exp + 1);
        FVar17.exp = (int)uVar9;
        FVar17.cls = (char)(uVar9 >> 0x20);
        FVar17.sign = (_Bool)(char)(uVar9 >> 0x28);
        FVar17._14_2_ = (short)(uVar9 >> 0x30);
        FVar17.frac = (ulong)((uint)uVar8 & 1) | uVar8 >> 1;
      }
      goto LAB_00a0c470;
    }
    if (((FVar16._12_4_ | uVar2) & 0xfc) != 0) {
LAB_00a0c272:
      FVar17 = pick_nan(FVar15,FVar16,status);
      goto LAB_00a0c470;
    }
    if ((FVar3 == float_class_inf) || (FVar4 == float_class_zero)) goto LAB_00a0c470;
    if ((FVar3 != float_class_zero) && (FVar4 != float_class_inf)) {
LAB_00a0c3d5:
      g_assertion_message_expr
                ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/fpu/softfloat.c"
                 ,0x428,(char *)0x0);
    }
    uVar9 = 0;
    if ((uVar11 & 0xff0000000000) != 0x10000000000) {
      uVar9 = 0x10000000000;
    }
    uVar9 = uVar11 & 0xffff00ffffffffff | uVar9;
  }
  else {
    if (FVar4 == float_class_normal && FVar3 == float_class_normal) {
      if ((iVar10 < iVar7) || ((iVar7 == iVar10 && (uVar8 <= uVar9)))) {
        iVar7 = iVar7 - iVar10;
        if (iVar7 != 0) {
          if (iVar7 < 0x40) {
            uVar8 = (ulong)(uVar8 << (-(byte)iVar7 & 0x3f) != 0) | uVar8 >> ((byte)iVar7 & 0x3f);
          }
          else {
            uVar8 = (ulong)(uVar8 != 0);
          }
        }
        uVar9 = uVar9 - uVar8;
      }
      else {
        iVar10 = iVar10 - iVar7;
        if (iVar10 != 0) {
          if (iVar10 < 0x40) {
            uVar9 = (ulong)(uVar9 << (-(byte)iVar10 & 0x3f) != 0) | uVar9 >> ((byte)iVar10 & 0x3f);
          }
          else {
            uVar9 = (ulong)(uVar9 != 0);
          }
        }
        uVar9 = uVar8 - uVar9;
        uVar14 = uVar14 & 0xffffffff00000000 | uVar11 & 0xffffffff;
        uVar12 = uVar2 >> 8 ^ 1;
      }
      if (uVar9 == 0) {
        uVar8 = uVar14 & 0xffffff00ffffffff | 0x100000000;
        uVar9 = (ulong)(status->float_rounding_mode == '\x01');
        uVar13 = 0;
      }
      else {
        lVar1 = 0x3f;
        if (uVar9 != 0) {
          for (; uVar9 >> lVar1 == 0; lVar1 = lVar1 + -1) {
          }
        }
        iVar7 = ((uint)lVar1 ^ 0x3f) - 1;
        uVar13 = uVar9 << ((byte)iVar7 & 0x3f);
        uVar8 = uVar14 & 0xffffffff00000000 | (ulong)(uint)((int)uVar14 - iVar7);
        uVar9 = (ulong)(uVar12 & 1);
      }
      uVar8 = uVar8 & 0xffff00ffffffffff | uVar9 << 0x28;
      FVar17.exp = (int)uVar8;
      FVar17.cls = (char)(uVar8 >> 0x20);
      FVar17.sign = (_Bool)(char)(uVar8 >> 0x28);
      FVar17._14_2_ = (short)(uVar8 >> 0x30);
      FVar17.frac = uVar13;
      goto LAB_00a0c470;
    }
    if (((FVar16._12_4_ | uVar2) & 0xfc) != 0) goto LAB_00a0c272;
    if (FVar3 == float_class_inf) {
      if (FVar4 == float_class_inf) {
        status->float_exception_flags = status->float_exception_flags | 1;
        FVar17.exp = 0x7fffffff;
        FVar17.cls = float_class_qnan;
        FVar17.sign = false;
        FVar17._14_2_ = 0;
        FVar17.frac = 0x3fffffffffffffff;
      }
      goto LAB_00a0c470;
    }
    if ((FVar3 == float_class_zero) && (FVar4 == float_class_zero)) {
      uVar8 = 0;
      if (status->float_rounding_mode == '\x01') {
        uVar8 = 0x10000000000;
      }
      uVar8 = uVar14 & 0xffff00ffffffffff | uVar8;
      FVar17.exp = (int)uVar8;
      FVar17.cls = (char)(uVar8 >> 0x20);
      FVar17.sign = (_Bool)(char)(uVar8 >> 0x28);
      FVar17._14_2_ = (short)(uVar8 >> 0x30);
      FVar17.frac = uVar9;
      goto LAB_00a0c470;
    }
    if ((FVar3 != float_class_zero) && (FVar4 != float_class_inf)) {
      if (FVar4 != float_class_zero) goto LAB_00a0c3d5;
      goto LAB_00a0c470;
    }
    uVar9 = (uVar11 & 0xffff00ffffffffff | uVar14 & 0xff0000000000) ^ 0x10000000000;
  }
  FVar17.exp = (int)uVar9;
  FVar17.cls = (char)(uVar9 >> 0x20);
  FVar17.sign = (_Bool)(char)(uVar9 >> 0x28);
  FVar17._14_2_ = (short)(uVar9 >> 0x30);
  FVar17.frac = uVar8;
LAB_00a0c470:
  FVar15 = round_canonical(FVar17,status,&float16_params);
  return (ushort)FVar15.frac & 0x3ff | (ushort)((FVar15.exp & 0x1fU) << 10) |
         (ushort)(FVar15._8_8_ >> 0x19) & 0x8000;
}

Assistant:

float16 QEMU_FLATTEN float16_sub(float16 a, float16 b, float_status *status)
{
    FloatParts pa = float16_unpack_canonical(a, status);
    FloatParts pb = float16_unpack_canonical(b, status);
    FloatParts pr = addsub_floats(pa, pb, true, status);

    return float16_round_pack_canonical(pr, status);
}